

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.cpp
# Opt level: O1

UInt32 crnlib::Bt3_MatchFinder_GetMatches(CMatchFinder *p,UInt32 *distances)

{
  byte *pbVar1;
  byte bVar2;
  uint lenLimit;
  byte *cur;
  CLzRef *pCVar3;
  UInt32 UVar4;
  UInt32 *pUVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  byte *pbVar10;
  UInt32 UVar11;
  bool bVar12;
  
  lenLimit = p->lenLimit;
  if (lenLimit < 3) {
    MatchFinder_MovePos(p);
    return 0;
  }
  cur = p->buffer;
  uVar7 = (uint)cur[1] ^ p->crc[*cur];
  uVar8 = uVar7 & 0x3ff;
  UVar4 = p->pos;
  pCVar3 = p->hash;
  uVar6 = UVar4 - pCVar3[uVar8];
  uVar7 = (((uint)cur[2] << 8 ^ uVar7) & p->hashMask) + 0x400;
  UVar11 = pCVar3[uVar7];
  pCVar3[uVar7] = UVar4;
  pCVar3[uVar8] = UVar4;
  UVar4 = 2;
  if ((uVar6 < p->cyclicBufferSize) && (cur[-(ulong)uVar6] == *cur)) {
    lVar9 = -(ulong)uVar6;
    if (cur[lVar9 + 2] == cur[2]) {
      UVar4 = 2;
      pbVar10 = cur + 3;
      do {
        bVar12 = UVar4 - lenLimit == -1;
        if (bVar12) {
          *distances = lenLimit;
          distances[1] = uVar6 - 1;
          goto LAB_001a299a;
        }
        pbVar1 = pbVar10 + lVar9;
        UVar4 = UVar4 + 1;
        bVar2 = *pbVar10;
        pbVar10 = pbVar10 + 1;
      } while (*pbVar1 == bVar2);
    }
    else {
      UVar4 = 2;
      bVar12 = false;
    }
    *distances = UVar4;
    distances[1] = uVar6 - 1;
    lVar9 = 2;
    if (bVar12) {
LAB_001a299a:
      SkipMatchesSpec(lenLimit,UVar11,p->pos,cur,p->son,p->cyclicBufferPos,p->cyclicBufferSize,
                      p->cutValue);
      p->cyclicBufferPos = p->cyclicBufferPos + 1;
      p->buffer = p->buffer + 1;
      UVar4 = p->pos + 1;
      p->pos = UVar4;
      UVar11 = 2;
      goto LAB_001a2958;
    }
  }
  else {
    lVar9 = 0;
  }
  pUVar5 = GetMatchesSpec1(lenLimit,UVar11,p->pos,cur,p->son,p->cyclicBufferPos,p->cyclicBufferSize,
                           p->cutValue,distances + lVar9,UVar4);
  UVar11 = (UInt32)((ulong)((long)pUVar5 - (long)distances) >> 2);
  p->cyclicBufferPos = p->cyclicBufferPos + 1;
  p->buffer = p->buffer + 1;
  UVar4 = p->pos + 1;
  p->pos = UVar4;
LAB_001a2958:
  if (UVar4 == p->posLimit) {
    MatchFinder_CheckLimits(p);
  }
  return UVar11;
}

Assistant:

static UInt32 Bt3_MatchFinder_GetMatches(CMatchFinder* p, UInt32* distances) {
  UInt32 hash2Value, delta2, maxLen, offset;
  GET_MATCHES_HEADER(3)

  HASH3_CALC;

  delta2 = p->pos - p->hash[hash2Value];
  curMatch = p->hash[kFix3HashSize + hashValue];

  p->hash[hash2Value] =
      p->hash[kFix3HashSize + hashValue] = p->pos;

  maxLen = 2;
  offset = 0;
  if (delta2 < p->cyclicBufferSize && *(cur - delta2) == *cur) {
    for (; maxLen != lenLimit; maxLen++)
      if (cur[(ptrdiff_t)maxLen - delta2] != cur[maxLen])
        break;
    distances[0] = maxLen;
    distances[1] = delta2 - 1;
    offset = 2;
    if (maxLen == lenLimit) {
      SkipMatchesSpec(lenLimit, curMatch, MF_PARAMS(p));
      MOVE_POS_RET;
    }
  }
  GET_MATCHES_FOOTER(offset, maxLen)
}